

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O0

uint8_t cueify_full_toc_get_track_control_flags(cueify_full_toc *t,uint8_t track)

{
  cueify_full_toc_private *toc;
  uint8_t track_local;
  cueify_full_toc *t_local;
  
  if (t == (cueify_full_toc *)0x0) {
    t_local._7_1_ = '\0';
  }
  else if ((track < *(byte *)((long)t + 2)) || (*(byte *)((long)t + 3) < track)) {
    t_local._7_1_ = '\0';
  }
  else {
    t_local._7_1_ = *(uint8_t *)((long)t + (ulong)track * 9 + 6);
  }
  return t_local._7_1_;
}

Assistant:

uint8_t cueify_full_toc_get_track_control_flags(cueify_full_toc *t,
						uint8_t track) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;

    if (toc == NULL) {
	return 0;
    } else if (track >= toc->first_track_number &&
	       track <= toc->last_track_number) {
	return toc->tracks[track].control;
    } else {
	return 0;
    }
}